

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrate_baseline.cpp
# Opt level: O3

double integrate(function<double_(double)> *func,double a,double b,double h,int threads_num)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double result;
  vector<unsigned_long,_std::allocator<unsigned_long>_> threads;
  vector<Argument,_std::allocator<Argument>_> args;
  pthread_mutex_t mutex;
  double local_a0;
  ulong local_98;
  double local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  vector<Argument,_std::allocator<Argument>_> local_70;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_90 = h;
  std::vector<Argument,_std::allocator<Argument>_>::vector
            (&local_70,(long)threads_num,(allocator_type *)&local_58);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_88,(long)threads_num,(allocator_type *)&local_58);
  iVar4 = 0;
  local_38 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_a0 = 0.0;
  if (0 < threads_num) {
    dVar7 = a;
    if (a <= b) {
      dVar7 = b;
      b = a;
    }
    dVar7 = (dVar7 - b) / (double)threads_num;
    lVar6 = 0x28;
    lVar5 = 0;
    local_98 = (ulong)(uint)threads_num;
    do {
      dVar1 = (double)iVar4;
      iVar4 = iVar4 + 1;
      *(undefined8 **)
       ((long)local_70.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
              super__Vector_impl_data._M_start + lVar6 + -0x28) = &local_58;
      *(double **)
       ((long)local_70.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
              super__Vector_impl_data._M_start + lVar6 + -0x20) = &local_a0;
      *(double *)
       ((long)local_70.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
              super__Vector_impl_data._M_start + lVar6 + -0x18) = dVar1 * dVar7 + b;
      *(double *)
       ((long)local_70.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
              super__Vector_impl_data._M_start + lVar6 + -0x10) = (double)iVar4 * dVar7 + b;
      *(double *)
       ((long)local_70.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
              super__Vector_impl_data._M_start + lVar6 + -8) = local_90;
      *(function<double_(double)> **)
       ((long)&(local_70.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
                super__Vector_impl_data._M_start)->mutex + lVar6) = func;
      pthread_create((pthread_t *)
                     ((long)local_88.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar5),(pthread_attr_t *)0x0,
                     integrate_thread,
                     (void *)((long)local_70.super__Vector_base<Argument,_std::allocator<Argument>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar6 + -0x28));
      uVar2 = local_98;
      lVar6 = lVar6 + 0x30;
      lVar5 = lVar5 + 8;
    } while ((ulong)(uint)threads_num * 8 - lVar5 != 0);
    if (0 < threads_num) {
      uVar3 = 0;
      do {
        pthread_join(local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar3],(void **)0x0);
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
  }
  dVar7 = local_a0;
  if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return dVar7;
}

Assistant:

double integrate(std::function<double(double)> const &func, double a, double b, double h, int threads_num){
  std::vector<Argument> args(static_cast<unsigned long>(threads_num));
  std::vector<pthread_t> threads(static_cast<unsigned long>(threads_num));
  pthread_mutex_t mutex = PTHREAD_MUTEX_INITIALIZER;
  if (b < a){
    std::swap(a, b);
  }
  double result = 0;
  double step = (b - a) / threads_num;
  for(auto i = 0; i < threads_num; ++i){
    args[i] = {&mutex, &result, a + step * i, a + step * (i + 1), h, &func};
    pthread_create(threads.data() + i, nullptr, integrate_thread, args.data() + i);
  }
  for(auto i = 0; i < threads_num; ++i) {
    pthread_join(threads[i], nullptr);
  }
  return result;
}